

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

OpCode __thiscall
ByteCodeGenerator::GetStSlotOp
          (ByteCodeGenerator *this,Scope *scope,int envIndex,RegSlot scopeLocation,bool chkBlockVar,
          FuncInfo *funcInfo)

{
  code *pcVar1;
  bool bVar2;
  ScopeType SVar3;
  FuncInfo *pFVar4;
  Scope *pSVar5;
  undefined4 *puVar6;
  OpCode local_32;
  OpCode op;
  FuncInfo *funcInfo_local;
  bool chkBlockVar_local;
  RegSlot scopeLocation_local;
  int envIndex_local;
  Scope *scope_local;
  ByteCodeGenerator *this_local;
  
  if (envIndex == -1) {
    if ((scopeLocation == 0xffffffff) || (scopeLocation != funcInfo->frameSlotsRegister)) {
      if ((scopeLocation == 0xffffffff) || (scopeLocation != funcInfo->frameObjRegister)) {
        bVar2 = Scope::HasInnerScopeIndex(scope);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x11f7,"(scope->HasInnerScopeIndex())","scope->HasInnerScopeIndex()");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        bVar2 = Scope::GetIsObject(scope);
        if (bVar2) {
          local_32 = StInnerObjSlot;
        }
        else {
          local_32 = StInnerSlot;
        }
      }
      else {
        SVar3 = Scope::GetScopeType(scope);
        if (SVar3 == ScopeType_Parameter) {
          pFVar4 = Scope::GetFunc(scope);
          pSVar5 = FuncInfo::GetCurrentChildScope(pFVar4);
          if (scope != pSVar5) {
            bVar2 = FuncInfo::IsBodyAndParamScopeMerged(funcInfo);
            if (bVar2) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar6 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                                 ,0x11ed,"(!funcInfo->IsBodyAndParamScopeMerged())",
                                 "!funcInfo->IsBodyAndParamScopeMerged()");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar6 = 0;
            }
            local_32 = StParamObjSlot;
            goto LAB_00b43123;
          }
        }
        local_32 = StLocalObjSlot;
      }
    }
    else {
      SVar3 = Scope::GetScopeType(scope);
      if (SVar3 == ScopeType_Parameter) {
        pFVar4 = Scope::GetFunc(scope);
        pSVar5 = FuncInfo::GetCurrentChildScope(pFVar4);
        if (scope != pSVar5) {
          bVar2 = FuncInfo::IsBodyAndParamScopeMerged(funcInfo);
          if (bVar2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0x11de,"(!funcInfo->IsBodyAndParamScopeMerged())",
                               "!funcInfo->IsBodyAndParamScopeMerged()");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
          local_32 = StParamSlot;
          goto LAB_00b43123;
        }
      }
      local_32 = StLocalSlot;
    }
  }
  else {
    bVar2 = Scope::GetIsObject(scope);
    if (bVar2) {
      local_32 = StEnvObjSlot;
    }
    else {
      local_32 = StEnvSlot;
    }
  }
LAB_00b43123:
  if (chkBlockVar) {
    local_32 = ToChkUndeclOp(this,local_32);
  }
  return local_32;
}

Assistant:

Js::OpCode
ByteCodeGenerator::GetStSlotOp(Scope *scope, int envIndex, Js::RegSlot scopeLocation, bool chkBlockVar, FuncInfo *funcInfo)
{
    Js::OpCode op;

    if (envIndex != -1)
    {
        if (scope->GetIsObject())
        {
            op = Js::OpCode::StEnvObjSlot;
        }
        else
        {
            op = Js::OpCode::StEnvSlot;
        }
    }
    else if (scopeLocation != Js::Constants::NoRegister &&
        scopeLocation == funcInfo->frameSlotsRegister)
    {
        if (scope->GetScopeType() == ScopeType_Parameter && scope != scope->GetFunc()->GetCurrentChildScope())
        {
            // Symbol is from the param scope of a split scope function and we are emitting the body.
            // We should use the param scope's bytecode now.
            Assert(!funcInfo->IsBodyAndParamScopeMerged());
            op = Js::OpCode::StParamSlot;
        }
        else
        {
            op = Js::OpCode::StLocalSlot;
        }
    }
    else if (scopeLocation != Js::Constants::NoRegister &&
        scopeLocation == funcInfo->frameObjRegister)
    {
        if (scope->GetScopeType() == ScopeType_Parameter && scope != scope->GetFunc()->GetCurrentChildScope())
        {
            // Symbol is from the param scope of a split scope function and we are emitting the body.
            // We should use the param scope's bytecode now.
            Assert(!funcInfo->IsBodyAndParamScopeMerged());
            op = Js::OpCode::StParamObjSlot;
        }
        else
        {
            op = Js::OpCode::StLocalObjSlot;
        }
    }
    else
    {
        Assert(scope->HasInnerScopeIndex());
        if (scope->GetIsObject())
        {
            op = Js::OpCode::StInnerObjSlot;
        }
        else
        {
            op = Js::OpCode::StInnerSlot;
        }
    }

    if (chkBlockVar)
    {
        op = this->ToChkUndeclOp(op);
    }

    return op;
}